

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_os_getenv(char *name,char *buffer,size_t *size)

{
  ulong uVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  
  iVar2 = -0x16;
  if ((size != (size_t *)0x0 && (buffer != (char *)0x0 && name != (char *)0x0)) &&
     (uVar1 = *size, iVar2 = -0x16, uVar1 != 0)) {
    __s = getenv(name);
    if (__s == (char *)0x0) {
      iVar2 = -2;
    }
    else {
      sVar3 = strlen(__s);
      iVar2 = -0x69;
      sVar4 = sVar3 + 1;
      if (sVar3 < uVar1) {
        memcpy(buffer,__s,sVar3 + 1);
        iVar2 = 0;
        sVar4 = sVar3;
      }
      *size = sVar4;
    }
  }
  return iVar2;
}

Assistant:

int uv_os_getenv(const char* name, char* buffer, size_t* size) {
  char* var;
  size_t len;

  if (name == NULL || buffer == NULL || size == NULL || *size == 0)
    return -EINVAL;

  var = getenv(name);

  if (var == NULL)
    return -ENOENT;

  len = strlen(var);

  if (len >= *size) {
    *size = len + 1;
    return -ENOBUFS;
  }

  memcpy(buffer, var, len + 1);
  *size = len;

  return 0;
}